

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O2

DdNode * Cudd_Dxygtdxz(DdManager *dd,int N,DdNode **x,DdNode **y,DdNode **z)

{
  int *piVar1;
  DdNode *g;
  DdNode *g_00;
  DdNode *h;
  DdNode *g_01;
  DdNode *n;
  DdNode *g_02;
  DdNode *n_00;
  DdNode *g_03;
  long lVar2;
  uint uVar3;
  
  g = dd->one;
  lVar2 = (long)N;
  g_00 = Cudd_bddIte(dd,y[lVar2 + -1],g,(DdNode *)((ulong)z[lVar2 + -1] ^ 1));
  if (g_00 != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)g_00 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    lVar2 = lVar2 + -1;
    h = Cudd_bddIte(dd,y[lVar2],z[lVar2],g);
    g_03 = g_00;
    if (h != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)h & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      g_01 = Cudd_bddIte(dd,x[lVar2],g_00,h);
      if (g_01 == (DdNode *)0x0) {
LAB_00620aa2:
        Cudd_RecursiveDeref(dd,g_00);
        g_03 = h;
      }
      else {
        piVar1 = (int *)(((ulong)g_01 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,g_00);
        Cudd_RecursiveDeref(dd,h);
        uVar3 = N - 2;
        while( true ) {
          if ((int)uVar3 < 0) {
            piVar1 = (int *)(((ulong)g_01 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            return (DdNode *)((ulong)g_01 ^ 1);
          }
          n = Cudd_bddIte(dd,z[uVar3],g,(DdNode *)((ulong)g_01 ^ 1));
          g_03 = g_01;
          if (n == (DdNode *)0x0) goto LAB_00620b57;
          piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          g_02 = Cudd_bddIte(dd,z[uVar3],g_01,g);
          if (g_02 == (DdNode *)0x0) break;
          piVar1 = (int *)(((ulong)g_02 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          n_00 = Cudd_bddIte(dd,z[uVar3],g,g_01);
          if (n_00 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,g_01);
            Cudd_RecursiveDeref(dd,n);
            g_03 = g_02;
            goto LAB_00620b57;
          }
          piVar1 = (int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          g_03 = Cudd_bddIte(dd,z[uVar3],g_01,(DdNode *)((ulong)g ^ 1));
          if (g_03 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,g_01);
            Cudd_RecursiveDeref(dd,n);
            g_00 = g_02;
            h = n_00;
            goto LAB_00620aa2;
          }
          piVar1 = (int *)(((ulong)g_03 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(dd,g_01);
          g_00 = Cudd_bddIte(dd,y[uVar3],g_02,(DdNode *)((ulong)n ^ 1));
          if (g_00 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,n);
            Cudd_RecursiveDeref(dd,g_02);
            Cudd_RecursiveDeref(dd,n_00);
            goto LAB_00620b57;
          }
          piVar1 = (int *)(((ulong)g_00 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          h = Cudd_bddIte(dd,y[uVar3],g_03,n_00);
          if (h == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,n);
            Cudd_RecursiveDeref(dd,g_02);
            Cudd_RecursiveDeref(dd,n_00);
            Cudd_RecursiveDeref(dd,g_03);
            g_03 = g_00;
            goto LAB_00620b57;
          }
          piVar1 = (int *)(((ulong)h & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(dd,n);
          Cudd_RecursiveDeref(dd,g_02);
          Cudd_RecursiveDeref(dd,n_00);
          Cudd_RecursiveDeref(dd,g_03);
          g_01 = Cudd_bddIte(dd,x[uVar3],g_00,h);
          if (g_01 == (DdNode *)0x0) goto LAB_00620aa2;
          piVar1 = (int *)(((ulong)g_01 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(dd,g_00);
          Cudd_RecursiveDeref(dd,h);
          uVar3 = uVar3 - 1;
        }
        Cudd_RecursiveDeref(dd,g_01);
        g_03 = n;
      }
    }
LAB_00620b57:
    Cudd_RecursiveDeref(dd,g_03);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_Dxygtdxz(
  DdManager * dd /* DD manager */,
  int  N /* number of x, y, and z variables */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */,
  DdNode ** z /* array of z variables */)
{
    DdNode *one, *zero;
    DdNode *z1, *z2, *z3, *z4, *y1_, *y2, *x1;
    int     i;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    /* Build bottom part of BDD outside loop. */
    y1_ = Cudd_bddIte(dd, y[N-1], one, Cudd_Not(z[N-1]));
    if (y1_ == NULL) return(NULL);
    cuddRef(y1_);
    y2 = Cudd_bddIte(dd, y[N-1], z[N-1], one);
    if (y2 == NULL) {
        Cudd_RecursiveDeref(dd, y1_);
        return(NULL);
    }
    cuddRef(y2);
    x1 = Cudd_bddIte(dd, x[N-1], y1_, y2);
    if (x1 == NULL) {
        Cudd_RecursiveDeref(dd, y1_);
        Cudd_RecursiveDeref(dd, y2);
        return(NULL);
    }
    cuddRef(x1);
    Cudd_RecursiveDeref(dd, y1_);
    Cudd_RecursiveDeref(dd, y2);

    /* Loop to build the rest of the BDD. */
    for (i = N-2; i >= 0; i--) {
        z1 = Cudd_bddIte(dd, z[i], one, Cudd_Not(x1));
        if (z1 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            return(NULL);
        }
        cuddRef(z1);
        z2 = Cudd_bddIte(dd, z[i], x1, one);
        if (z2 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            Cudd_RecursiveDeref(dd, z1);
            return(NULL);
        }
        cuddRef(z2);
        z3 = Cudd_bddIte(dd, z[i], one, x1);
        if (z3 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            return(NULL);
        }
        cuddRef(z3);
        z4 = Cudd_bddIte(dd, z[i], x1, zero);
        if (z4 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            Cudd_RecursiveDeref(dd, z3);
            return(NULL);
        }
        cuddRef(z4);
        Cudd_RecursiveDeref(dd, x1);
        y1_ = Cudd_bddIte(dd, y[i], z2, Cudd_Not(z1));
        if (y1_ == NULL) {
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            Cudd_RecursiveDeref(dd, z3);
            Cudd_RecursiveDeref(dd, z4);
            return(NULL);
        }
        cuddRef(y1_);
        y2 = Cudd_bddIte(dd, y[i], z4, z3);
        if (y2 == NULL) {
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            Cudd_RecursiveDeref(dd, z3);
            Cudd_RecursiveDeref(dd, z4);
            Cudd_RecursiveDeref(dd, y1_);
            return(NULL);
        }
        cuddRef(y2);
        Cudd_RecursiveDeref(dd, z1);
        Cudd_RecursiveDeref(dd, z2);
        Cudd_RecursiveDeref(dd, z3);
        Cudd_RecursiveDeref(dd, z4);
        x1 = Cudd_bddIte(dd, x[i], y1_, y2);
        if (x1 == NULL) {
            Cudd_RecursiveDeref(dd, y1_);
            Cudd_RecursiveDeref(dd, y2);
            return(NULL);
        }
        cuddRef(x1);
        Cudd_RecursiveDeref(dd, y1_);
        Cudd_RecursiveDeref(dd, y2);
    }
    cuddDeref(x1);
    return(Cudd_Not(x1));

}